

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void absl::CheckForMutexCorruption(intptr_t v,char *label)

{
  char *absl_raw_log_internal_basename_1;
  char *absl_raw_log_internal_basename;
  uintptr_t w;
  char *label_local;
  intptr_t v_local;
  
  if (((v ^ 4U) & (v ^ 4U) << 3 & 0x28) == 0) {
    return;
  }
  if ((v & 9U) != 9) {
    if ((v & 0x24U) != 0x20) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x7af,"void absl::CheckForMutexCorruption(intptr_t, const char *)");
    }
    raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x7ae,
               "Check (v & (kMuWait | kMuWrWait)) != kMuWrWait failed: %s: Mutex corrupt: waiting writer with no waiters: %p"
               ,label,v);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x7ae,"void absl::CheckForMutexCorruption(intptr_t, const char *)");
  }
  raw_log_internal::RawLog
            (kFatal,"mutex.cc",0x7ab,
             "Check (v & (kMuWriter | kMuReader)) != (kMuWriter | kMuReader) failed: %s: Mutex corrupt: both reader and writer lock held: %p"
             ,label,v);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0x7ab,"void absl::CheckForMutexCorruption(intptr_t, const char *)");
}

Assistant:

static void CheckForMutexCorruption(intptr_t v, const char* label) {
  // Test for either of two situations that should not occur in v:
  //   kMuWriter and kMuReader
  //   kMuWrWait and !kMuWait
  const uintptr_t w = static_cast<uintptr_t>(v ^ kMuWait);
  // By flipping that bit, we can now test for:
  //   kMuWriter and kMuReader in w
  //   kMuWrWait and kMuWait in w
  // We've chosen these two pairs of values to be so that they will overlap,
  // respectively, when the word is left shifted by three.  This allows us to
  // save a branch in the common (correct) case of them not being coincident.
  static_assert(kMuReader << 3 == kMuWriter, "must match");
  static_assert(kMuWait << 3 == kMuWrWait, "must match");
  if (ABSL_PREDICT_TRUE((w & (w << 3) & (kMuWriter | kMuWrWait)) == 0)) return;
  RAW_CHECK_FMT((v & (kMuWriter | kMuReader)) != (kMuWriter | kMuReader),
                "%s: Mutex corrupt: both reader and writer lock held: %p",
                label, reinterpret_cast<void*>(v));
  RAW_CHECK_FMT((v & (kMuWait | kMuWrWait)) != kMuWrWait,
                "%s: Mutex corrupt: waiting writer with no waiters: %p", label,
                reinterpret_cast<void*>(v));
  assert(false);
}